

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,DeclarationsWithMethod *ptr)

{
  Declarations *second;
  MethodDeclaration *second_00;
  DeclarationsWithMethod *pDVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  DeclarationsWithMethod *local_18;
  DeclarationsWithMethod *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (DeclarationsWithMethod *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"decl with method",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pDVar1 = local_18;
  second = local_18->prev_decls;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"decls",&local_71);
  arrow(this,pDVar1,second,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (**(local_18->prev_decls->super_Base)._vptr_Base)(local_18->prev_decls,this);
  pDVar1 = local_18;
  second_00 = local_18->method_decl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"method decl",&local_99);
  arrow(this,pDVar1,second_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  (**(local_18->method_decl->super_Declaration).super_Base._vptr_Base)(local_18->method_decl,this);
  return;
}

Assistant:

void gv_visitor::visit(DeclarationsWithMethod* ptr) {
    box(ptr, "decl with method");
    arrow(ptr, ptr->prev_decls, "decls");
    ptr->prev_decls->accept(this);
    arrow(ptr, ptr->method_decl, "method decl");
    ptr->method_decl->accept(this);
}